

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

Result __thiscall tonk::gateway::ParsedXML::Parse(ParsedXML *this,char *data,uint bytes)

{
  char cVar1;
  char *__s1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *extraout_RAX;
  char *pcVar3;
  uint in_ECX;
  undefined4 in_register_00000014;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  string *this_00;
  Result *success;
  ParsedXML *pPVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  string noVersion;
  string serviceType;
  string controlURL;
  string tagData;
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  long local_c0;
  ParsedXML *local_b8;
  string *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string *local_60;
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  lVar4 = CONCAT44(in_register_00000014,bytes);
  uVar9 = 0;
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  local_a0 = local_90;
  **(undefined1 **)data = 0;
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  **(undefined1 **)(data + 0x20) = 0;
  data[0x48] = '\0';
  data[0x49] = '\0';
  data[0x4a] = '\0';
  data[0x4b] = '\0';
  data[0x4c] = '\0';
  data[0x4d] = '\0';
  data[0x4e] = '\0';
  data[0x4f] = '\0';
  local_80 = local_70;
  **(undefined1 **)(data + 0x40) = 0;
  local_98 = 0;
  local_78 = 0;
  local_90[0] = 0;
  local_70[0] = 0;
  local_b8 = this;
  local_b0 = (string *)data;
  if (in_ECX != 0) {
    uVar6 = 0;
    uVar5 = 0;
    local_a8 = 0;
    local_58 = (string *)(data + 0x20);
    local_60 = (string *)(data + 0x40);
    local_c0 = lVar4;
    do {
      uVar8 = (uint)uVar9;
      if (uVar8 == 0) {
        uVar9 = 0;
        if (*(char *)(lVar4 + uVar6) == '<') {
          uVar9 = uVar6 + 1 & 0xffffffff;
        }
      }
      else if (*(char *)(lVar4 + uVar6) == '>') {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,uVar9 + lVar4,(ulong)((int)uVar6 - uVar8) + uVar9 + lVar4);
        cVar1 = *local_50[0];
        if (cVar1 == '/') {
          pcVar3 = local_50[0] + 1;
          if (uVar5 < uVar8) {
            if ((local_a8 & 1) == 0) {
              iVar2 = strcasecmp(pcVar3,"URLBase");
              if (iVar2 != 0) goto LAB_0015831f;
              local_e0 = local_d0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,(ulong)uVar5 + local_c0,
                         (ulong)(uVar8 + ~uVar5) + (ulong)uVar5 + local_c0);
              this_00 = local_b0;
            }
            else {
              iVar2 = strcasecmp(pcVar3,"serviceType");
              if (iVar2 == 0) {
                local_e0 = local_d0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e0,(ulong)uVar5 + local_c0,
                           (ulong)(uVar8 + ~uVar5) + (ulong)uVar5 + local_c0);
                this_00 = (string *)&local_a0;
              }
              else {
                iVar2 = strcasecmp(pcVar3,"controlURL");
                if (iVar2 != 0) goto LAB_0015831f;
                local_e0 = local_d0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e0,(ulong)uVar5 + local_c0,
                           (ulong)(uVar8 + ~uVar5) + (ulong)uVar5 + local_c0);
                this_00 = (string *)&local_80;
              }
            }
            std::__cxx11::string::operator=(this_00,(string *)&local_e0);
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
          }
LAB_0015831f:
          iVar2 = strcasecmp(pcVar3,"service");
          pcVar3 = (char *)CONCAT44(extraout_var_00,iVar2);
          if (iVar2 == 0) {
            if (2 < local_98) {
              std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_a0);
              __s1 = local_e0;
              iVar2 = strcasecmp(local_e0,"urn:schemas-upnp-org:service:WANIPConnection");
              if (iVar2 == 0) {
                bVar10 = true;
              }
              else {
                iVar2 = strcasecmp(__s1,"urn:schemas-upnp-org:service:WANPPPConnection");
                bVar10 = iVar2 == 0;
              }
              pcVar3 = local_d0;
              if (__s1 != pcVar3) {
                operator_delete(__s1);
                pcVar3 = extraout_RAX;
              }
              if (bVar10) {
                std::__cxx11::string::_M_assign(local_58);
                pcVar3 = (char *)std::__cxx11::string::_M_assign(local_60);
              }
            }
            goto LAB_001583c5;
          }
        }
        else {
          iVar2 = strcasecmp(local_50[0],"service");
          pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
          if (iVar2 == 0) {
LAB_001583c5:
            local_a8 = CONCAT71((int7)((ulong)pcVar3 >> 8),cVar1 != '/');
          }
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        uVar5 = (int)uVar6 + 1;
        uVar9 = 0;
        lVar4 = local_c0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != in_ECX);
  }
  if (*(long *)(local_b0 + 0x28) == 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Unable to find ServiceType","");
    pcVar3 = (char *)operator_new(0x38);
    pPVar7 = local_b8;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(char **)(pcVar3 + 8) = pcVar3 + 0x18;
    std::__cxx11::string::_M_construct<char*>((string *)(pcVar3 + 8),local_e0,local_e0 + local_d8);
  }
  else {
    if (*(long *)(local_b0 + 0x48) != 0) {
      (local_b8->URLBase)._M_dataplus._M_p = (char *)0x0;
      pPVar7 = local_b8;
      goto LAB_001584f9;
    }
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Unable to find ControlURL","");
    pPVar7 = local_b8;
    pcVar3 = (char *)operator_new(0x38);
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(char **)(pcVar3 + 8) = pcVar3 + 0x18;
    std::__cxx11::string::_M_construct<char*>((string *)(pcVar3 + 8),local_e0,local_e0 + local_d8);
  }
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x30] = '\x02';
  pcVar3[0x31] = '\0';
  pcVar3[0x32] = '\0';
  pcVar3[0x33] = '\0';
  pcVar3[0x34] = '\0';
  pcVar3[0x35] = '\0';
  pcVar3[0x36] = '\0';
  pcVar3[0x37] = '\0';
  (pPVar7->URLBase)._M_dataplus._M_p = pcVar3;
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
LAB_001584f9:
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return (Result)(ErrorResult *)pPVar7;
}

Assistant:

Result ParsedXML::Parse(const char* data, unsigned bytes)
{
    URLBase.clear();
    ServiceType.clear();
    ControlURL.clear();

    unsigned tag_start = 0, data_start = 0;
    bool inService = false;
    std::string serviceType, controlURL;

    for (unsigned i = 0; i < bytes; ++i)
    {
        char ch = data[i];
        if (tag_start != 0)
        {
            if (ch == '>')
            {
                std::string tagData(data + tag_start, i - tag_start);
                const char* tag = tagData.c_str();
                bool end = (tag[0] == '/');

                if (end)
                {
                    ++tag;
                    if (tag_start > data_start)
                    {
                        if (inService)
                        {
                            if (0 == StrCaseCompare(tag, "serviceType")) {
                                serviceType = std::string(data + data_start, tag_start - data_start - 1);
                            }
                            else if (0 == StrCaseCompare(tag, "controlURL")) {
                                controlURL = std::string(data + data_start, tag_start - data_start - 1);
                            }
                        }
                        else if (0 == StrCaseCompare(tag, "URLBase")) {
                            URLBase = std::string(data + data_start, tag_start - data_start - 1);
                        }
                    }
                }

                if (0 == StrCaseCompare(tag, "service"))
                {
                    if (end && IsWANConnectionServiceType(serviceType))
                    {
                        ServiceType = serviceType;
                        ControlURL = controlURL;
                    }
                    inService = !end;
                }

                tag_start = 0;
                data_start = i + 1;
            }
        }
        else if (ch == '<') {
            tag_start = i + 1;
        }
    }

    if (ServiceType.empty()) {
        return Result("Unable to find ServiceType");
    }
    if (ControlURL.empty()) {
        return Result("Unable to find ControlURL");
    }
    return Result::Success();
}